

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  Array<kj::ReadableDirectory::Entry> *result;
  StringPtr value;
  DebugExpression<bool> _kjCondition;
  Fault local_90;
  ArrayBuilder<kj::ReadableDirectory::Entry> builder;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<char> local_48;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&lock,&this->impl);
  sVar3 = ((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory::Entry>(sVar3)
  ;
  builder.endPtr = builder.ptr + sVar3;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  p_Var2 = ((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  builder.pos = builder.ptr;
  do {
    if ((_Rb_tree_header *)p_Var2 == &((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header) {
      __return_storage_ptr__->ptr = builder.ptr;
      __return_storage_ptr__->size_ = (long)builder.pos - (long)builder.ptr >> 5;
      __return_storage_ptr__->disposer = builder.disposer;
      builder.ptr = (Entry *)0x0;
      builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
      builder.endPtr = (Entry *)0x0;
      ArrayBuilder<kj::ReadableDirectory::Entry>::dispose(&builder);
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
      return __return_storage_ptr__;
    }
    iVar1 = *(int *)&p_Var2[2]._M_parent;
    if (iVar1 == 1) {
      sVar3 = 0;
    }
    else {
      sVar3 = 2;
      if (iVar1 != 3) {
        _kjCondition.value = iVar1 == 2;
        if (!_kjCondition.value) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    (&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x3ff,FAILED,"e.second.node.is<DirectoryNode>()","_kjCondition,",&_kjCondition
                    );
          kj::_::Debug::Fault::fatal(&local_90);
        }
        sVar3 = 1;
      }
    }
    value.content.size_ = sVar3;
    value.content.ptr = (char *)p_Var2[1]._M_parent;
    heapString((String *)&local_48,*(kj **)(p_Var2 + 1),value);
    (builder.pos)->type = (Type)sVar3;
    ((builder.pos)->name).content.ptr = local_48.ptr;
    ((builder.pos)->name).content.size_ = local_48.size_;
    ((builder.pos)->name).content.disposer = local_48.disposer;
    local_48.ptr = (char *)0x0;
    local_48.size_ = 0;
    builder.pos = builder.pos + 1;
    Array<char>::~Array(&local_48);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }